

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleIDCase::init(SampleIDCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  MessageBuilder local_320;
  MessageBuilder local_190;
  SampleIDCase *local_10;
  SampleIDCase *this_local;
  
  local_10 = this;
  if (this->m_vericationMode == VERIFY_USING_SAMPLES) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                        super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_190,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_190,
                        (char (*) [98])
                        "Writing gl_SampleID to the green channel of the texture and verifying texture values, expecting:\n"
                       );
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [37])"\t1) 0 with non-multisample targets.\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [56])
                               "\t2) value N at sample index N of a multisample texture\n");
    ctx = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_190);
  }
  else if (this->m_vericationMode == VERIFY_USING_SELECTION) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                        super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_320,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_320,
                        (char (*) [96])
                        "Selecting a single sample id for each pixel and writing color only if gl_SampleID == selected.\n"
                       );
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [92])
                               "Expecting all output pixels to be partially (multisample) or fully (singlesample) colored.\n"
                       );
    ctx = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_320);
  }
  iVar1 = MultisampleRenderCase::init(&this->super_MultisampleRenderCase,ctx);
  return iVar1;
}

Assistant:

void SampleIDCase::init (void)
{
	// log the test method and expectations
	if (m_vericationMode == VERIFY_USING_SAMPLES)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Writing gl_SampleID to the green channel of the texture and verifying texture values, expecting:\n"
			<< "	1) 0 with non-multisample targets.\n"
			<< "	2) value N at sample index N of a multisample texture\n"
			<< tcu::TestLog::EndMessage;
	else if (m_vericationMode == VERIFY_USING_SELECTION)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Selecting a single sample id for each pixel and writing color only if gl_SampleID == selected.\n"
			<< "Expecting all output pixels to be partially (multisample) or fully (singlesample) colored.\n"
			<< tcu::TestLog::EndMessage;
	else
		DE_ASSERT(false);

	MultisampleRenderCase::init();
}